

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

uint32 rw::d3d9::getDeclaration(void *declaration,VertexElement *elements)

{
  long lVar1;
  uint32 uVar2;
  VertexElement *e;
  int n;
  VertexElement *elements_local;
  void *declaration_local;
  
  e._4_4_ = 0;
  do {
    uVar2 = e._4_4_ + 1;
    lVar1 = (long)(int)e._4_4_;
    e._4_4_ = uVar2;
  } while (*(short *)((long)declaration + lVar1 * 8) != 0xff);
  if (elements != (VertexElement *)0x0) {
    memcpy(elements,declaration,(long)(int)uVar2 << 3);
  }
  return uVar2;
}

Assistant:

uint32
getDeclaration(void *declaration, VertexElement *elements)
{
#ifdef RW_D3D9
	IDirect3DVertexDeclaration9 *decl = (IDirect3DVertexDeclaration9*)declaration;
	UINT numElt;
	decl->GetDeclaration((D3DVERTEXELEMENT9*)elements, &numElt);
	return numElt;
#else
	int n = 0;
	VertexElement *e = (VertexElement*)declaration;
	while(e[n++].stream != 0xFF)
		;
	if(elements)
		memcpy(elements, declaration, n*sizeof(VertexElement));
	return n;
#endif
}